

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int64_t __thiscall MovParsedSRTTrackData::getSttsVal(MovParsedSRTTrackData *this)

{
  long lVar1;
  size_type sVar2;
  ostream *poVar3;
  int64_t iVar4;
  VodCoreException *this_00;
  reference pvVar5;
  string local_1b8;
  ostringstream local_188 [8];
  ostringstream ss;
  MovParsedSRTTrackData *this_local;
  
  if (this->sttsCnt == 0) {
    this->sttsPos = this->sttsPos + 1;
    lVar1 = this->sttsPos;
    sVar2 = std::vector<MOVStts,_std::allocator<MOVStts>_>::size(&this->m_sc->stts_data);
    if ((long)(sVar2 & 0xffffffff) <= lVar1) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar3 = std::operator<<((ostream *)local_188,
                               "MP4/MOV error: invalid stts index for SRT track #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_sc->ffindex);
      poVar3 = std::operator<<(poVar3," at position ");
      iVar4 = IOContextDemuxer::getProcessedBytes(&this->m_demuxer->super_IOContextDemuxer);
      std::ostream::operator<<(poVar3,iVar4);
      this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(this_00,0x3b6,&local_1b8);
      __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    pvVar5 = std::vector<MOVStts,_std::allocator<MOVStts>_>::operator[]
                       (&this->m_sc->stts_data,this->sttsPos);
    this->sttsCnt = (ulong)pvVar5->count;
  }
  this->sttsCnt = this->sttsCnt + -1;
  pvVar5 = std::vector<MOVStts,_std::allocator<MOVStts>_>::operator[]
                     (&this->m_sc->stts_data,this->sttsPos);
  return (pvVar5->duration * 1000) / (long)(ulong)this->m_sc->time_scale;
}

Assistant:

int64_t getSttsVal()
    {
        if (sttsCnt == 0)
        {
            sttsPos++;
            if (sttsPos >= static_cast<unsigned>(m_sc->stts_data.size()))
                THROW(ERR_MOV_PARSE, "MP4/MOV error: invalid stts index for SRT track #"
                                         << m_sc->ffindex << " at position " << m_demuxer->getProcessedBytes())

            sttsCnt = m_sc->stts_data[sttsPos].count;
        }
        sttsCnt--;
        return m_sc->stts_data[sttsPos].duration * 1000 / m_sc->time_scale;
    }